

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ostream_iterator<char,_char,_std::char_traits<char>_>
fmt::v5::internal::
format_decimal<char,unsigned_int,std::ostream_iterator<char,char,std::char_traits<char>>,fmt::v5::internal::no_thousands_sep>
          (ostream_type *out,undefined8 *param_2,undefined4 num_digits,undefined4 param_4)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *it;
  type tVar1;
  ostream_iterator<char,_char,_std::char_traits<char>_> oVar2;
  char_type buffer [13];
  char local_35 [13];
  undefined8 local_28;
  undefined8 uStack_20;
  
  it = (ostream_iterator<char,_char,_std::char_traits<char>_> *)
       format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                 (local_35,num_digits,param_4);
  local_28 = *param_2;
  uStack_20 = param_2[1];
  tVar1 = copy_str<char,char*,std::ostream_iterator<char,char,std::char_traits<char>>>
                    ((char *)out,local_35,it);
  oVar2._M_string = tVar1._M_string;
  oVar2._M_stream = out;
  return oVar2;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}